

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

void __thiscall FRemapTable::AddToTranslation(FRemapTable *this,char *range)

{
  int start;
  int end;
  int iVar1;
  int _g1;
  int _b1;
  int _r2;
  int _g2;
  double r1;
  double g1;
  double b1;
  double r2;
  double g2;
  size_t sVar2;
  FScanner sc;
  
  FScanner::FScanner(&sc);
  sVar2 = strlen(range);
  FScanner::OpenMem(&sc,"translation",range,(int)sVar2);
  FScanner::SetCMode(&sc,true);
  FScanner::MustGetToken(&sc,0x104);
  start = sc.Number;
  FScanner::MustGetToken(&sc,0x3a);
  FScanner::MustGetToken(&sc,0x104);
  end = sc.Number;
  FScanner::MustGetToken(&sc,0x3d);
  if ((uint)end < 0x100 && (uint)start < 0x100) {
    FScanner::MustGetAnyToken(&sc);
    if (sc.TokenType == 0x25) {
      FScanner::MustGetToken(&sc,0x5b);
      FScanner::MustGetAnyToken(&sc);
      if (sc.TokenType != 0x104) {
        FScanner::TokenMustBe(&sc,0x106);
      }
      r1 = sc.Float;
      FScanner::MustGetToken(&sc,0x2c);
      FScanner::MustGetAnyToken(&sc);
      if (sc.TokenType != 0x104) {
        FScanner::TokenMustBe(&sc,0x106);
      }
      g1 = sc.Float;
      FScanner::MustGetToken(&sc,0x2c);
      FScanner::MustGetAnyToken(&sc);
      if (sc.TokenType != 0x104) {
        FScanner::TokenMustBe(&sc,0x106);
      }
      b1 = sc.Float;
      FScanner::MustGetToken(&sc,0x5d);
      FScanner::MustGetToken(&sc,0x3a);
      FScanner::MustGetToken(&sc,0x5b);
      FScanner::MustGetAnyToken(&sc);
      if (sc.TokenType != 0x104) {
        FScanner::TokenMustBe(&sc,0x106);
      }
      r2 = sc.Float;
      FScanner::MustGetToken(&sc,0x2c);
      FScanner::MustGetAnyToken(&sc);
      if (sc.TokenType != 0x104) {
        FScanner::TokenMustBe(&sc,0x106);
      }
      g2 = sc.Float;
      FScanner::MustGetToken(&sc,0x2c);
      FScanner::MustGetAnyToken(&sc);
      if (sc.TokenType != 0x104) {
        FScanner::TokenMustBe(&sc,0x106);
      }
      FScanner::MustGetToken(&sc,0x5d);
      AddDesaturation(this,start,end,r1,g1,b1,r2,g2,sc.Float);
    }
    else if (sc.TokenType == 0x5b) {
      FScanner::MustGetToken(&sc,0x104);
      iVar1 = sc.Number;
      FScanner::MustGetToken(&sc,0x2c);
      FScanner::MustGetToken(&sc,0x104);
      _g1 = sc.Number;
      FScanner::MustGetToken(&sc,0x2c);
      FScanner::MustGetToken(&sc,0x104);
      _b1 = sc.Number;
      FScanner::MustGetToken(&sc,0x5d);
      FScanner::MustGetToken(&sc,0x3a);
      FScanner::MustGetToken(&sc,0x5b);
      FScanner::MustGetToken(&sc,0x104);
      _r2 = sc.Number;
      FScanner::MustGetToken(&sc,0x2c);
      FScanner::MustGetToken(&sc,0x104);
      _g2 = sc.Number;
      FScanner::MustGetToken(&sc,0x2c);
      FScanner::MustGetToken(&sc,0x104);
      FScanner::MustGetToken(&sc,0x5d);
      AddColorRange(this,start,end,iVar1,_g1,_b1,_r2,_g2,sc.Number);
    }
    else {
      FScanner::TokenMustBe(&sc,0x104);
      iVar1 = sc.Number;
      FScanner::MustGetToken(&sc,0x3a);
      FScanner::MustGetToken(&sc,0x104);
      AddIndexRange(this,start,end,iVar1,sc.Number);
    }
  }
  else {
    FScanner::ScriptError(&sc,"Palette index out of range");
  }
  FScanner::~FScanner(&sc);
  return;
}

Assistant:

void FRemapTable::AddToTranslation(const char *range)
{
	int start,end;
	bool desaturated = false;
	FScanner sc;

	sc.OpenMem("translation", range, int(strlen(range)));
	sc.SetCMode(true);

	try
	{
		sc.MustGetToken(TK_IntConst);
		start = sc.Number;
		sc.MustGetToken(':');
		sc.MustGetToken(TK_IntConst);
		end = sc.Number;
		sc.MustGetToken('=');
		if (start < 0 || start > 255 || end < 0 || end > 255)
		{
			sc.ScriptError("Palette index out of range");
			return;
		}

		sc.MustGetAnyToken();

		if (sc.TokenType != '[' && sc.TokenType != '%')
		{
			int pal1,pal2;

			sc.TokenMustBe(TK_IntConst);
			pal1 = sc.Number;
			sc.MustGetToken(':');
			sc.MustGetToken(TK_IntConst);
			pal2 = sc.Number;
			AddIndexRange(start, end, pal1, pal2);
		}
		else if (sc.TokenType == '[')
		{ 
			// translation using RGB values
			int r1,g1,b1,r2,g2,b2;

			sc.MustGetToken(TK_IntConst);
			r1 = sc.Number;
			sc.MustGetToken(',');

			sc.MustGetToken(TK_IntConst);
			g1 = sc.Number;
			sc.MustGetToken(',');

			sc.MustGetToken(TK_IntConst);
			b1 = sc.Number;
			sc.MustGetToken(']');
			sc.MustGetToken(':');
			sc.MustGetToken('[');

			sc.MustGetToken(TK_IntConst);
			r2 = sc.Number;
			sc.MustGetToken(',');

			sc.MustGetToken(TK_IntConst);
			g2 = sc.Number;
			sc.MustGetToken(',');

			sc.MustGetToken(TK_IntConst);
			b2 = sc.Number;
			sc.MustGetToken(']');

			AddColorRange(start, end, r1, g1, b1, r2, g2, b2);
		}
		else if (sc.TokenType == '%')
		{
			// translation using RGB values
			double r1,g1,b1,r2,g2,b2;

			sc.MustGetToken('[');
			sc.MustGetAnyToken();
			if (sc.TokenType != TK_IntConst) sc.TokenMustBe(TK_FloatConst);
			r1 = sc.Float;
			sc.MustGetToken(',');

			sc.MustGetAnyToken();
			if (sc.TokenType != TK_IntConst) sc.TokenMustBe(TK_FloatConst);
			g1 = sc.Float;
			sc.MustGetToken(',');

			sc.MustGetAnyToken();
			if (sc.TokenType != TK_IntConst) sc.TokenMustBe(TK_FloatConst);
			b1 = sc.Float;
			sc.MustGetToken(']');
			sc.MustGetToken(':');
			sc.MustGetToken('[');

			sc.MustGetAnyToken();
			if (sc.TokenType != TK_IntConst) sc.TokenMustBe(TK_FloatConst);
			r2 = sc.Float;
			sc.MustGetToken(',');

			sc.MustGetAnyToken();
			if (sc.TokenType != TK_IntConst) sc.TokenMustBe(TK_FloatConst);
			g2 = sc.Float;
			sc.MustGetToken(',');

			sc.MustGetAnyToken();
			if (sc.TokenType != TK_IntConst) sc.TokenMustBe(TK_FloatConst);
			b2 = sc.Float;
			sc.MustGetToken(']');

			AddDesaturation(start, end, r1, g1, b1, r2, g2, b2);
		}
	}
	catch (CRecoverableError &err)
	{
		Printf("Error in translation '%s':\n%s\n", range, err.GetMessage());
	}
}